

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O2

void __thiscall DSuicider::Tick(DSuicider *this)

{
  TObjPtr<APlayerPawn> *obj;
  ActorFlags *pAVar1;
  byte *pbVar2;
  double dVar3;
  APlayerPawn *pAVar4;
  APlayerPawn *inflictor;
  APlayerPawn *source;
  DAngle angle;
  FName local_2c;
  undefined8 local_28;
  
  obj = &this->Pawn;
  pAVar4 = GC::ReadBarrier<APlayerPawn>((APlayerPawn **)obj);
  pAVar1 = &(pAVar4->super_AActor).flags;
  *(byte *)&pAVar1->Value = (byte)pAVar1->Value | 4;
  pAVar4 = GC::ReadBarrier<APlayerPawn>((APlayerPawn **)obj);
  pbVar2 = (byte *)((long)&(pAVar4->super_AActor).flags2.Value + 3);
  *pbVar2 = *pbVar2 & 0xf7;
  pAVar4 = GC::ReadBarrier<APlayerPawn>((APlayerPawn **)obj);
  dVar3 = (pAVar4->super_AActor).DamageFactor;
  pAVar4 = GC::ReadBarrier<APlayerPawn>((APlayerPawn **)obj);
  (pAVar4->super_AActor).DamageFactor = 1.0;
  pAVar4 = GC::ReadBarrier<APlayerPawn>((APlayerPawn **)obj);
  inflictor = GC::ReadBarrier<APlayerPawn>((APlayerPawn **)obj);
  source = GC::ReadBarrier<APlayerPawn>((APlayerPawn **)obj);
  local_2c.Index = 0xbe;
  local_28 = 0;
  P_DamageMobj(&pAVar4->super_AActor,&inflictor->super_AActor,&source->super_AActor,1000000,
               &local_2c,0,angle);
  pAVar4 = GC::ReadBarrier<APlayerPawn>((APlayerPawn **)obj);
  (pAVar4->super_AActor).DamageFactor = dVar3;
  pAVar4 = GC::ReadBarrier<APlayerPawn>((APlayerPawn **)obj);
  if ((pAVar4->super_AActor).health < 1) {
    pAVar4 = GC::ReadBarrier<APlayerPawn>((APlayerPawn **)obj);
    pAVar1 = &(pAVar4->super_AActor).flags;
    *(byte *)&pAVar1->Value = (byte)pAVar1->Value & 0xfb;
  }
  (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
  return;
}

Assistant:

void Tick()
	{
		Pawn->flags |= MF_SHOOTABLE;
		Pawn->flags2 &= ~MF2_INVULNERABLE;
		// Store the player's current damage factor, to restore it later.
		double plyrdmgfact = Pawn->DamageFactor;
		Pawn->DamageFactor = 1.;
		P_DamageMobj (Pawn, Pawn, Pawn, TELEFRAG_DAMAGE, NAME_Suicide);
		Pawn->DamageFactor = plyrdmgfact;
		if (Pawn->health <= 0)
		{
			Pawn->flags &= ~MF_SHOOTABLE;
		}
		Destroy();
	}